

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

int __thiscall RandStrParser::parseInt(RandStrParser *this)

{
  int iVar1;
  wchar_t c;
  RandStrParser *in_RDI;
  int acc;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = more(in_RDI);
    uVar2 = false;
    if (iVar1 != 0) {
      getch((RandStrParser *)(ulong)in_stack_ffffffffffffffe0);
      iVar1 = is_digit(L'\0');
      uVar2 = iVar1 != 0;
    }
    if ((bool)uVar2 == false) break;
    c = getch((RandStrParser *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
    iVar1 = value_of_digit(c);
    local_c = iVar1 + local_c * 10;
    skip((RandStrParser *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
  }
  return local_c;
}

Assistant:

int parseInt()
    {
        /* parse digits in the input */
        int acc;
        for (acc = 0 ; more() && is_digit(getch()) ; skip())
        {
            /* add this digit into the accumulator */
            acc *= 10;
            acc += value_of_digit(getch());
        }

        /* return the accumulator value */
        return acc;
    }